

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_graph_adj_set.h
# Opt level: O1

void __thiscall
data_structures::WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet
          (WeightedGraphAdjSet<int,_int> *this,Node *v)

{
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar1;
  undefined8 *puVar2;
  long *plVar3;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_1;
  
  this->_vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010d988;
  (this->_table)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010d9b8;
  (this->_table)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010d9e8;
  pLVar1 = (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010da18;
  (pLVar1->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010da48;
  pLVar1->_next =
       (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar1->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar1->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar1->element).value.weight = 0;
  (this->_table)._list._header = pLVar1;
  (this->_table)._list._tail = pLVar1;
  (this->_table)._list._size = 0;
  puVar2 = (undefined8 *)operator_new(0x38);
  *puVar2 = &PTR__ListNode_0010da18;
  puVar2[2] = &PTR__SymbolTableElement_0010da48;
  puVar2[1] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  *(undefined4 *)(puVar2 + 6) = 0;
  pLVar1 = (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010da18;
  (pLVar1->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010da48;
  pLVar1->_next =
       (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar1->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar1->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar1->element).value.weight = 0;
  (this->_table)._list._header = pLVar1;
  (this->_table)._list._tail = pLVar1;
  (this->_table)._list._size = 0;
  *puVar2 = &PTR__ListNode_0010da18;
  puVar2[1] = 0;
  operator_delete(puVar2,0x38);
  this->_vertex = v;
  puVar2 = (undefined8 *)operator_new(0x38);
  *puVar2 = &PTR__ListNode_0010da18;
  puVar2[2] = &PTR__SymbolTableElement_0010da48;
  puVar2[1] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  *(undefined4 *)(puVar2 + 6) = 0;
  puVar2 = (undefined8 *)operator_new(0x38);
  *puVar2 = &PTR__ListNode_0010da18;
  puVar2[2] = &PTR__SymbolTableElement_0010da48;
  puVar2[1] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  *(undefined4 *)(puVar2 + 6) = 0;
  plVar3 = (long *)operator_new(0x38);
  *plVar3 = (long)&PTR__ListNode_0010da18;
  plVar3[2] = (long)&PTR__SymbolTableElement_0010da48;
  plVar3[1] = 0;
  plVar3[4] = 0;
  plVar3[5] = 0;
  *(undefined4 *)(plVar3 + 6) = 0;
  *puVar2 = &PTR__ListNode_0010da18;
  puVar2[1] = 0;
  operator_delete(puVar2,0x38);
  pLVar1 = (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010da18;
  (pLVar1->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010da48;
  pLVar1->_next =
       (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar1->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar1->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar1->element).value.weight = 0;
  (this->_table)._list._header = pLVar1;
  (this->_table)._list._tail = pLVar1;
  (this->_table)._list._size = 0;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  return;
}

Assistant:

inline
    WeightedGraphAdjSet<T, Weight>::WeightedGraphAdjSet(Node* v){
        _vertex = v;
        _table = SymbolTable<Node*, Edge>();
    }